

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlUTF8Strsize(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  int local_2c;
  int local_28;
  int n_len;
  int len;
  int n_utf;
  xmlChar *utf;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_len = 0; n_len < 5; n_len = n_len + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_xmlChar_ptr(n_len,0);
      local_28 = gen_int(local_2c,1);
      if (val != (xmlChar *)0x0) {
        iVar2 = xmlStrlen(val);
        if (iVar2 < local_28) {
          local_28 = 0;
        }
      }
      iVar2 = xmlUTF8Strsize(val,local_28);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(n_len,val,0);
      des_int(local_2c,local_28,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strsize",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)(uint)n_len);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlUTF8Strsize(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    const xmlChar * utf; /* a sequence of UTF-8 encoded bytes */
    int n_utf;
    int len; /* the number of characters in the array */
    int n_len;

    for (n_utf = 0;n_utf < gen_nb_const_xmlChar_ptr;n_utf++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        utf = gen_const_xmlChar_ptr(n_utf, 0);
        len = gen_int(n_len, 1);
        if ((utf != NULL) &&
            (len > xmlStrlen(BAD_CAST utf)))
            len = 0;

        ret_val = xmlUTF8Strsize(utf, len);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_utf, utf, 0);
        des_int(n_len, len, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlUTF8Strsize",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_utf);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}